

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O0

void __thiscall
cmDebugger::cmDebuggerAdapter::OnMessageOutput(cmDebuggerAdapter *this,MessageType t,string *text)

{
  bool bVar1;
  pointer this_00;
  element_type *this_01;
  StoppedEvent *pSVar2;
  pointer this_02;
  pointer this_03;
  int64_t local_e0;
  undefined1 local_d8 [8];
  optional<dap::StoppedEvent> stoppedEvent;
  string *text_local;
  MessageType t_local;
  cmDebuggerAdapter *this_local;
  
  stoppedEvent.super__Optional_base<dap::StoppedEvent,_false,_false>._M_payload.
  super__Optional_payload<dap::StoppedEvent,_true,_false,_false>.
  super__Optional_payload_base<dap::StoppedEvent>._176_8_ = text;
  this_00 = std::
            unique_ptr<cmDebugger::cmDebuggerExceptionManager,_std::default_delete<cmDebugger::cmDebuggerExceptionManager>_>
            ::operator->(&this->ExceptionManager);
  cmDebuggerExceptionManager::RaiseExceptionIfAny
            ((optional<dap::StoppedEvent> *)local_d8,this_00,t,
             (string *)
             stoppedEvent.super__Optional_base<dap::StoppedEvent,_false,_false>._M_payload.
             super__Optional_payload<dap::StoppedEvent,_true,_false,_false>.
             super__Optional_payload_base<dap::StoppedEvent>._176_8_);
  bVar1 = std::optional<dap::StoppedEvent>::has_value((optional<dap::StoppedEvent> *)local_d8);
  if (bVar1) {
    this_01 = std::
              __shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->DefaultThread);
    local_e0 = cmDebuggerThread::GetId(this_01);
    pSVar2 = std::optional<dap::StoppedEvent>::operator->((optional<dap::StoppedEvent> *)local_d8);
    dap::optional<dap::integer>::operator=(&pSVar2->threadId,&local_e0);
    this_02 = std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->
                        (&this->Session);
    pSVar2 = std::optional<dap::StoppedEvent>::operator*((optional<dap::StoppedEvent> *)local_d8);
    dap::Session::send<dap::StoppedEvent,void>(this_02,pSVar2);
    this_03 = std::unique_ptr<cmDebugger::Semaphore,_std::default_delete<cmDebugger::Semaphore>_>::
              operator->(&this->ContinueSem);
    Semaphore::Wait(this_03);
  }
  std::optional<dap::StoppedEvent>::~optional((optional<dap::StoppedEvent> *)local_d8);
  return;
}

Assistant:

void cmDebuggerAdapter::OnMessageOutput(MessageType t, std::string const& text)
{
  cm::optional<dap::StoppedEvent> stoppedEvent =
    ExceptionManager->RaiseExceptionIfAny(t, text);
  if (stoppedEvent.has_value()) {
    stoppedEvent->threadId = DefaultThread->GetId();
    Session->send(*stoppedEvent);
    ContinueSem->Wait();
  }
}